

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O2

vector<Character_*,_std::allocator<Character_*>_> * __thiscall
Map::CharactersInRange
          (vector<Character_*,_std::allocator<Character_*>_> *__return_storage_ptr__,Map *this,
          uchar x,uchar y,uchar range)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  undefined3 in_register_00000081;
  _List_node_base *p_Var4;
  Character *character;
  value_type local_38;
  
  (__return_storage_ptr__->super__Vector_base<Character_*,_std::allocator<Character_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Character_*,_std::allocator<Character_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Character_*,_std::allocator<Character_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var4 = (_List_node_base *)&this->characters;
  while (p_Var4 = (((_List_base<Character_*,_std::allocator<Character_*>_> *)&p_Var4->_M_next)->
                  _M_impl)._M_node.super__List_node_base._M_next,
        p_Var4 != (_List_node_base *)&this->characters) {
    local_38 = (value_type)p_Var4[1]._M_next;
    iVar3 = (uint)local_38->x - (int)CONCAT71(in_register_00000011,x);
    iVar1 = -iVar3;
    if (0 < iVar3) {
      iVar1 = iVar3;
    }
    iVar2 = (uint)local_38->y - (int)CONCAT71(in_register_00000009,y);
    iVar3 = -iVar2;
    if (0 < iVar2) {
      iVar3 = iVar2;
    }
    if ((uint)(iVar3 + iVar1) <= CONCAT31(in_register_00000081,range)) {
      std::vector<Character_*,_std::allocator<Character_*>_>::push_back
                (__return_storage_ptr__,&local_38);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Character *> Map::CharactersInRange(unsigned char x, unsigned char y, unsigned char range)
{
	std::vector<Character *> characters;

	UTIL_FOREACH(this->characters, character)
	{
		if (util::path_length(character->x, character->y, x, y) <= range)
			characters.push_back(character);
	}

	return characters;
}